

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inflate_copy.cc
# Opt level: O1

void __thiscall inflate_copy_back_and_forth_Test::TestBody(inflate_copy_back_and_forth_Test *this)

{
  undefined8 *puVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  int err;
  zng_stream d1_stream;
  zng_stream d2_stream;
  Message local_100;
  AssertHelper local_f8;
  internal local_f0 [8];
  undefined8 *local_e8;
  int32_t local_dc;
  zng_stream local_d8;
  zng_stream local_70;
  
  local_d8.next_in = (uint8_t *)0x0;
  local_d8.avail_in = 0;
  local_d8._12_4_ = 0;
  local_d8.total_in = 0;
  local_d8.next_out = (uint8_t *)0x0;
  local_d8.avail_out = 0;
  local_d8._36_4_ = 0;
  local_d8.total_out = 0;
  local_d8.msg = (char *)0x0;
  local_d8.state = (internal_state *)0x0;
  local_d8.zalloc = (alloc_func)0x0;
  local_d8.zfree = (free_func)0x0;
  local_d8.opaque = (void *)0x0;
  local_d8.data_type = 0;
  local_d8.adler = 0;
  local_d8.reserved = 0;
  local_dc = zng_inflateInit2(&local_d8,0x1d);
  local_100.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>(local_f0,"err","0",&local_dc,(int *)&local_100);
  puVar1 = local_e8;
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message(&local_100);
    if (local_e8 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_inflate_copy.cc"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_100);
  }
  else {
    if (local_e8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_e8 != local_e8 + 2) {
        operator_delete((undefined8 *)*local_e8);
      }
      operator_delete(puVar1);
    }
    local_dc = zng_inflateCopy(&local_70,&local_d8);
    local_100.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>(local_f0,"err","0",&local_dc,(int *)&local_100);
    puVar1 = local_e8;
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message(&local_100);
      if (local_e8 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*local_e8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_inflate_copy.cc"
                 ,0x16,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_100);
    }
    else {
      if (local_e8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_e8 != local_e8 + 2) {
          operator_delete((undefined8 *)*local_e8);
        }
        operator_delete(puVar1);
      }
      local_dc = zng_inflateEnd(&local_d8);
      local_100.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>(local_f0,"err","0",&local_dc,(int *)&local_100);
      puVar1 = local_e8;
      if (local_f0[0] == (internal)0x0) {
        testing::Message::Message(&local_100);
        if (local_e8 == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (char *)*local_e8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_inflate_copy.cc"
                   ,0x18,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f8,&local_100);
      }
      else {
        if (local_e8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_e8 != local_e8 + 2) {
            operator_delete((undefined8 *)*local_e8);
          }
          operator_delete(puVar1);
        }
        local_dc = zng_inflateCopy(&local_d8,&local_70);
        local_100.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>(local_f0,"err","0",&local_dc,(int *)&local_100);
        puVar1 = local_e8;
        if (local_f0[0] == (internal)0x0) {
          testing::Message::Message(&local_100);
          if (local_e8 == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = (char *)*local_e8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_inflate_copy.cc"
                     ,0x1a,pcVar2);
          testing::internal::AssertHelper::operator=(&local_f8,&local_100);
        }
        else {
          if (local_e8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_e8 != local_e8 + 2) {
              operator_delete((undefined8 *)*local_e8);
            }
            operator_delete(puVar1);
          }
          local_dc = zng_inflateEnd(&local_d8);
          local_100.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>(local_f0,"err","0",&local_dc,(int *)&local_100);
          puVar1 = local_e8;
          if (local_f0[0] == (internal)0x0) {
            testing::Message::Message(&local_100);
            if (local_e8 == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (char *)*local_e8;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_inflate_copy.cc"
                       ,0x1c,pcVar2);
            testing::internal::AssertHelper::operator=(&local_f8,&local_100);
          }
          else {
            if (local_e8 != (undefined8 *)0x0) {
              if ((undefined8 *)*local_e8 != local_e8 + 2) {
                operator_delete((undefined8 *)*local_e8);
              }
              operator_delete(puVar1);
            }
            local_dc = zng_inflateEnd(&local_70);
            local_100.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ = 0;
            testing::internal::CmpHelperEQ<int,int>(local_f0,"err","0",&local_dc,(int *)&local_100);
            if (local_f0[0] != (internal)0x0) goto LAB_0012364f;
            testing::Message::Message(&local_100);
            if (local_e8 == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (char *)*local_e8;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_inflate_copy.cc"
                       ,0x1e,pcVar2);
            testing::internal::AssertHelper::operator=(&local_f8,&local_100);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_f8);
  if ((long *)CONCAT44(local_100.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_100.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_100.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_100.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
LAB_0012364f:
  if (local_e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8 != local_e8 + 2) {
      operator_delete((undefined8 *)*local_e8);
    }
    operator_delete(local_e8);
  }
  return;
}

Assistant:

TEST(inflate, copy_back_and_forth) {
    PREFIX3(stream) d1_stream, d2_stream;
    int err;

    memset(&d1_stream, 0, sizeof(d1_stream));
    err = PREFIX(inflateInit2)(&d1_stream, MAX_WBITS + 14);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateCopy)(&d2_stream, &d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateCopy)(&d1_stream, &d2_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d2_stream);
    ASSERT_EQ(err, Z_OK);
}